

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

char * NameWriteUnsigned(char *pos,uint value)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  char reverse [16];
  
  pbVar3 = (byte *)(reverse + 1);
  reverse[0] = (char)value + (char)(value / 10) * -10 | 0x30;
  if (9 < value) {
    do {
      *pbVar3 = (char)(value / 10) + (char)(((ulong)value / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar3 = pbVar3 + 1;
      bVar2 = 99 < value;
      value = value / 10;
    } while (bVar2);
  }
  do {
    pbVar1 = pbVar3 + -1;
    pbVar3 = pbVar3 + -1;
    *pos = *pbVar1;
    pos = (char *)((byte *)pos + 1);
  } while (pbVar3 != (byte *)reverse);
  return pos;
}

Assistant:

char* NameWriteUnsigned(char *pos, unsigned value)
{
	char reverse[16];
	char *curr = reverse;

	*curr++ = (char)((value % 10) + '0');

	while(value /= 10)
		*curr++ = (char)((value % 10) + '0');

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != reverse);

	return pos;
}